

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<QToolBar_*> * findChildrenHelper<QToolBar*>(QObject *o)

{
  QObjectList *this;
  QList<QObject_*> *this_00;
  qsizetype qVar1;
  QToolBar *pQVar2;
  QList<QToolBar_*> *in_RDI;
  QToolBar *t;
  int i;
  QObjectList *list;
  QList<QToolBar_*> *result;
  parameter_type in_stack_ffffffffffffffb8;
  int local_20;
  
  this = QObject::children((QObject *)0x5f4ef4);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QToolBar_*>::QList((QList<QToolBar_*> *)0x5f4f28);
  local_20 = 0;
  while( true ) {
    this_00 = (QList<QObject_*> *)(long)local_20;
    qVar1 = QList<QObject_*>::size(this);
    if (qVar1 <= (long)this_00) break;
    QList<QObject_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffb8);
    pQVar2 = qobject_cast<QToolBar*>((QObject *)0x5f4f68);
    if (pQVar2 != (QToolBar *)0x0) {
      QList<QToolBar_*>::append((QList<QToolBar_*> *)0x5f4f84,in_stack_ffffffffffffffb8);
    }
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

static QList<T> findChildrenHelper(const QObject *o)
{
    const QObjectList &list = o->children();
    QList<T> result;

    for (int i=0; i < list.size(); ++i) {
        if (T t = qobject_cast<T>(list[i])) {
            result.append(t);
        }
    }

    return result;
}